

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

bool comparesEqual(QJsonObject *lhs,QJsonObject *rhs)

{
  long lVar1;
  bool bVar2;
  QCborContainerPrivate *pQVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  qsizetype end;
  qsizetype i;
  QCborValue *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  byte in_stack_ffffffffffffff87;
  qsizetype in_stack_ffffffffffffff90;
  QCborContainerPrivate *in_stack_ffffffffffffff98;
  long local_58;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator==((QExplicitlySharedDataPointer<QCborContainerPrivate> *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                     (QExplicitlySharedDataPointer<QCborContainerPrivate> *)
                     in_stack_ffffffffffffff78);
  if (bVar2) {
    local_39 = true;
  }
  else {
    bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b0f);
    if (bVar2) {
      pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b1f);
      qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
      local_39 = (bool)((qVar4 != 0 ^ 0xffU) & 1);
    }
    else {
      bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                        ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b49);
      if (bVar2) {
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b59);
        qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
        local_39 = (bool)((qVar4 != 0 ^ 0xffU) & 1);
      }
      else {
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b83);
        qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
        pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491b9e);
        qVar5 = QList<QtCbor::Element>::size(&pQVar3->elements);
        if (qVar4 == qVar5) {
          local_58 = 0;
          pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491bd4);
          qVar4 = QList<QtCbor::Element>::size(&pQVar3->elements);
          for (; local_58 < qVar4; local_58 = local_58 + 1) {
            QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491bff);
            QCborContainerPrivate::valueAt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x491c1b);
            QCborContainerPrivate::valueAt(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            in_stack_ffffffffffffff87 =
                 operator!=((QCborValue *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                            in_stack_ffffffffffffff78);
            QCborValue::~QCborValue
                      ((QCborValue *)
                       CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
            QCborValue::~QCborValue
                      ((QCborValue *)
                       CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
            if ((in_stack_ffffffffffffff87 & 1) != 0) {
              local_39 = false;
              goto LAB_00491c9f;
            }
          }
          local_39 = true;
        }
        else {
          local_39 = false;
        }
      }
    }
  }
LAB_00491c9f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QJsonObject &lhs, const QJsonObject &rhs)
{
    if (lhs.o == rhs.o)
        return true;

    if (!lhs.o)
        return !rhs.o->elements.size();
    if (!rhs.o)
        return !lhs.o->elements.size();
    if (lhs.o->elements.size() != rhs.o->elements.size())
        return false;

    for (qsizetype i = 0, end = lhs.o->elements.size(); i < end; ++i) {
        if (lhs.o->valueAt(i) != rhs.o->valueAt(i))
            return false;
    }

    return true;
}